

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  filenames_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  filenames_01;
  bool bVar1;
  int iVar2;
  vector<float,_std::allocator<float>_> *pvVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  size_type sVar5;
  ulong uVar6;
  long in_RSI;
  undefined1 auVar7 [16];
  ParsedScene scene;
  FormattingScene formattingScene;
  optional<std::vector<int,_std::allocator<int>_>_> p_1;
  optional<std::vector<int,_std::allocator<int>_>_> p;
  optional<std::vector<float,_std::allocator<float>_>_> c;
  string pixel;
  string pixelBounds;
  string cropWindow;
  anon_class_1_0_00000001 onError;
  bool toPly;
  bool format;
  string renderCoordSys;
  string logLevel;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  PBRTOptions options;
  value_type *in_stack_ffffffffffffe5c8;
  undefined2 uVar8;
  LogLevel in_stack_ffffffffffffe5d0;
  undefined1 in_stack_ffffffffffffe5d4;
  undefined1 in_stack_ffffffffffffe5d5;
  undefined1 in_stack_ffffffffffffe5d6;
  undefined1 in_stack_ffffffffffffe5d7;
  string *in_stack_ffffffffffffe5d8;
  undefined7 in_stack_ffffffffffffe5e0;
  byte in_stack_ffffffffffffe5e7;
  char **in_stack_ffffffffffffe5f0;
  undefined7 in_stack_ffffffffffffe5f8;
  undefined1 in_stack_ffffffffffffe5ff;
  allocator<char> *in_stack_ffffffffffffe600;
  char *in_stack_ffffffffffffe608;
  undefined7 in_stack_ffffffffffffe610;
  undefined1 in_stack_ffffffffffffe617;
  allocator<char> *in_stack_ffffffffffffe618;
  undefined1 *in_stack_ffffffffffffe620;
  char *in_stack_ffffffffffffe628;
  LogLevel in_stack_ffffffffffffe634;
  byte *in_stack_ffffffffffffe678;
  undefined1 *in_stack_ffffffffffffe680;
  undefined7 in_stack_ffffffffffffe688;
  undefined1 in_stack_ffffffffffffe68f;
  SceneRepresentation *in_stack_ffffffffffffe6c0;
  undefined7 in_stack_ffffffffffffe6c8;
  undefined1 in_stack_ffffffffffffe6cf;
  allocator<char> *in_stack_ffffffffffffe6d0;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_ffffffffffffe7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe7a8;
  undefined7 in_stack_ffffffffffffe7b0;
  undefined1 in_stack_ffffffffffffe7b7;
  allocator<char> *in_stack_ffffffffffffe7b8;
  bool local_17f9;
  ParsedScene *in_stack_ffffffffffffe9c0;
  ParsedScene *in_stack_ffffffffffffecd0;
  string local_a68 [32];
  string local_a48 [39];
  byte local_a21;
  char *local_a20 [4];
  byte local_9fb;
  byte local_9fa;
  allocator<char> local_9f9;
  string local_9f8 [39];
  byte local_9d1;
  char local_9d0 [37];
  byte local_9ab;
  byte local_9aa;
  allocator<char> local_9a9;
  string local_9a8 [39];
  byte local_981;
  char local_980 [37];
  byte local_95b;
  byte local_95a;
  allocator<char> local_959;
  string local_958 [39];
  byte local_931;
  byte local_90b;
  byte local_90a;
  allocator<char> local_909;
  string local_908 [39];
  byte local_8e1;
  byte local_8bb;
  byte local_8ba;
  allocator<char> local_8b9;
  string local_8b8 [39];
  byte local_891;
  undefined1 local_890 [37];
  byte local_86b;
  byte local_86a;
  allocator<char> local_869;
  string local_868 [39];
  byte local_841;
  byte local_81b;
  byte local_81a;
  allocator<char> local_819;
  string local_818 [39];
  byte local_7f1;
  SceneRepresentation local_7f0 [2];
  byte local_7cb;
  byte local_7ca;
  allocator<char> local_7c9;
  string local_7c8 [39];
  byte local_7a1;
  byte local_77b;
  byte local_77a;
  allocator<char> local_779;
  string local_778 [39];
  byte local_751;
  byte local_72b;
  byte local_72a;
  allocator<char> local_729;
  string local_728 [39];
  byte local_701;
  byte local_6db;
  byte local_6da;
  allocator<char> local_6d9;
  string local_6d8 [39];
  byte local_6b1;
  byte local_68b;
  byte local_68a;
  allocator<char> local_689;
  string local_688 [39];
  byte local_661;
  byte local_63b;
  byte local_63a;
  allocator<char> local_639;
  string local_638 [39];
  byte local_611;
  byte local_5eb;
  byte local_5ea;
  allocator<char> local_5e9;
  string local_5e8 [39];
  byte local_5c1;
  byte local_59b;
  byte local_59a;
  allocator<char> local_599;
  string local_598 [39];
  byte local_571;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  byte local_54b;
  byte local_54a;
  allocator<char> local_549;
  string local_548 [39];
  byte local_521;
  byte local_4fb;
  byte local_4fa;
  allocator<char> local_4f9;
  string local_4f8 [39];
  byte local_4d1;
  byte local_4ab;
  byte local_4aa;
  allocator<char> local_4a9;
  string local_4a8 [71];
  allocator<char> local_461;
  string local_460 [71];
  allocator<char> local_419;
  string local_418 [32];
  undefined1 local_3f8 [16];
  optional local_3e8 [71];
  allocator<char> local_3a1;
  string local_3a0 [71];
  allocator<char> local_359;
  string local_358 [32];
  undefined1 local_338 [16];
  optional local_328 [71];
  allocator<char> local_2e1;
  string local_2e0 [64];
  int local_2a0;
  allocator<char> local_299;
  string local_298 [32];
  undefined1 local_278 [16];
  optional local_268 [71];
  allocator<char> local_221;
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [39];
  allocator<char> local_199;
  string local_198 [37];
  byte local_173;
  byte local_172;
  allocator<char> local_171;
  string local_170 [55];
  allocator<char> local_139;
  string local_138 [65];
  byte local_f7 [2];
  byte local_f5;
  byte local_f1;
  undefined4 local_f0;
  LogLevel local_ec;
  undefined1 local_e8 [144];
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_58 [2];
  long *local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = (long *)in_RSI;
  pbrt::PBRTOptions::PBRTOptions
            ((PBRTOptions *)
             CONCAT17(in_stack_ffffffffffffe5d7,
                      CONCAT16(in_stack_ffffffffffffe5d6,
                               CONCAT15(in_stack_ffffffffffffe5d5,
                                        CONCAT14(in_stack_ffffffffffffe5d4,in_stack_ffffffffffffe5d0
                                                )))));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x42ff6b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe617,in_stack_ffffffffffffe610),in_stack_ffffffffffffe608
             ,in_stack_ffffffffffffe600);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe617,in_stack_ffffffffffffe610),in_stack_ffffffffffffe608
             ,in_stack_ffffffffffffe600);
  std::allocator<char>::~allocator(&local_171);
  local_172 = 0;
  local_173 = 0;
  local_10 = (long *)((long)local_10 + 8);
  do {
    while( true ) {
      iVar2 = (int)((ulong)in_stack_ffffffffffffe620 >> 0x20);
      if (*local_10 == 0) {
        if (((((local_f7[0] & 1) == 0) && ((local_172 & 1) == 0)) && ((local_173 & 1) == 0)) &&
           ((local_f5 & 1) == 0)) {
          printf("pbrt version 4 (built %s at %s)\n","May  2 2025","16:21:56");
          printf("Copyright (c)1998-2020 Matt Pharr, Wenzel Jakob, and Greg Humphreys.\n");
          printf(
                "The source code to pbrt (but *not* the book contents) is covered by the Apache 2.0 License.\n"
                );
          printf("See the file LICENSE.txt for the conditions of the license.\n");
          fflush(_stdout);
        }
        in_stack_ffffffffffffe5d7 =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_ffffffffffffe5d7,
                                      CONCAT16(in_stack_ffffffffffffe5d6,
                                               CONCAT15(in_stack_ffffffffffffe5d5,
                                                        CONCAT14(in_stack_ffffffffffffe5d4,
                                                                 in_stack_ffffffffffffe5d0)))),
                             (char *)in_stack_ffffffffffffe5c8);
        if ((bool)in_stack_ffffffffffffe5d7) {
          local_f0 = 0;
          local_17f9 = (bool)in_stack_ffffffffffffe5e7;
        }
        else {
          in_stack_ffffffffffffe5d6 =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_ffffffffffffe5d7,
                                        CONCAT16(in_stack_ffffffffffffe5d6,
                                                 CONCAT15(in_stack_ffffffffffffe5d5,
                                                          CONCAT14(in_stack_ffffffffffffe5d4,
                                                                   in_stack_ffffffffffffe5d0)))),
                               (char *)in_stack_ffffffffffffe5c8);
          if ((bool)in_stack_ffffffffffffe5d6) {
            local_f0 = 1;
            local_17f9 = (bool)in_stack_ffffffffffffe5e7;
          }
          else {
            in_stack_ffffffffffffe5d5 =
                 std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_ffffffffffffe5d7,
                                             CONCAT16(in_stack_ffffffffffffe5d6,
                                                      CONCAT15(in_stack_ffffffffffffe5d5,
                                                               CONCAT14(in_stack_ffffffffffffe5d4,
                                                                        in_stack_ffffffffffffe5d0)))
                                            ),(char *)in_stack_ffffffffffffe5c8);
            if (!(bool)in_stack_ffffffffffffe5d5) {
              pbrt::ErrorExit<std::__cxx11::string&>
                        ((char *)in_stack_ffffffffffffe600,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8));
            }
            local_f0 = 2;
            local_17f9 = (bool)in_stack_ffffffffffffe5e7;
          }
        }
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) != 0) {
            pbrt::ErrorExit<>((char *)in_stack_ffffffffffffe600);
          }
        }
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) != 0) {
            pbrt::ErrorExit<>((char *)in_stack_ffffffffffffe600);
          }
        }
        in_stack_ffffffffffffe5d0 = pbrt::LogLevelFromString(in_stack_ffffffffffffe5c8);
        uVar8 = (undefined2)((ulong)in_stack_ffffffffffffe5c8 >> 0x30);
        local_ec = in_stack_ffffffffffffe5d0;
        pbrt::InitPBRT((PBRTOptions *)CONCAT17(in_stack_ffffffffffffe617,in_stack_ffffffffffffe610))
        ;
        if ((((local_172 & 1) == 0) && ((local_173 & 1) == 0)) && ((local_f5 & 1) == 0)) {
          pbrt::ParsedScene::ParsedScene(in_stack_ffffffffffffe9c0);
          pstd::span<std::__cxx11::string_const>::
          span<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(local_17f9,in_stack_ffffffffffffe5e0),
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffe5d8);
          filenames_01.ptr._7_1_ = in_stack_ffffffffffffe6cf;
          filenames_01.ptr._0_7_ = in_stack_ffffffffffffe6c8;
          filenames_01.n = (size_t)in_stack_ffffffffffffe6d0;
          pbrt::ParseFiles(in_stack_ffffffffffffe6c0,filenames_01);
          if ((local_f1 & 1) == 0) {
            pbrt::CPURender(in_stack_ffffffffffffecd0);
          }
          else {
            pbrt::GPURender((ParsedScene *)0x433013);
          }
          if (pbrt::LOGGING_LogLevel < 1) {
            pbrt::GetCurrentRSS();
            pbrt::Log<unsigned_long>
                      (in_stack_ffffffffffffe634,in_stack_ffffffffffffe628,iVar2,
                       (char *)in_stack_ffffffffffffe618,
                       (unsigned_long *)
                       CONCAT17(in_stack_ffffffffffffe617,in_stack_ffffffffffffe610));
          }
          pbrt::CleanupPBRT();
          pbrt::ParsedScene::~ParsedScene
                    ((ParsedScene *)
                     CONCAT17(in_stack_ffffffffffffe5d7,
                              CONCAT16(in_stack_ffffffffffffe5d6,
                                       CONCAT15(in_stack_ffffffffffffe5d5,
                                                CONCAT14(in_stack_ffffffffffffe5d4,
                                                         in_stack_ffffffffffffe5d0)))));
        }
        else {
          pbrt::FormattingScene::FormattingScene
                    ((FormattingScene *)
                     CONCAT17(in_stack_ffffffffffffe5d7,
                              CONCAT16(in_stack_ffffffffffffe5d6,
                                       CONCAT15(in_stack_ffffffffffffe5d5,
                                                CONCAT14(in_stack_ffffffffffffe5d4,
                                                         in_stack_ffffffffffffe5d0)))),
                     SUB21((ushort)uVar8 >> 8,0),SUB21(uVar8,0));
          pstd::span<std::__cxx11::string_const>::
          span<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(local_17f9,in_stack_ffffffffffffe5e0),
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffe5d8);
          filenames_00.ptr._7_1_ = in_stack_ffffffffffffe6cf;
          filenames_00.ptr._0_7_ = in_stack_ffffffffffffe6c8;
          filenames_00.n = (size_t)in_stack_ffffffffffffe6d0;
          pbrt::ParseFiles(in_stack_ffffffffffffe6c0,filenames_00);
          pbrt::FormattingScene::~FormattingScene
                    ((FormattingScene *)
                     CONCAT17(in_stack_ffffffffffffe5d7,
                              CONCAT16(in_stack_ffffffffffffe5d6,
                                       CONCAT15(in_stack_ffffffffffffe5d5,
                                                CONCAT14(in_stack_ffffffffffffe5d4,
                                                         in_stack_ffffffffffffe5d0)))));
        }
        local_4 = 0;
        local_2a0 = 1;
        goto LAB_004330c2;
      }
      if (*(char *)*local_10 == '-') break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe617,in_stack_ffffffffffffe610),
                 in_stack_ffffffffffffe608,in_stack_ffffffffffffe600);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT17(in_stack_ffffffffffffe5d7,
                              CONCAT16(in_stack_ffffffffffffe5d6,
                                       CONCAT15(in_stack_ffffffffffffe5d5,
                                                CONCAT14(in_stack_ffffffffffffe5d4,
                                                         in_stack_ffffffffffffe5d0)))),
                  in_stack_ffffffffffffe5c8);
      std::__cxx11::string::~string(local_198);
      std::allocator<char>::~allocator(&local_199);
      local_10 = local_10 + 1;
    }
    std::__cxx11::string::string(local_1c0);
    std::__cxx11::string::string(local_1e0);
    std::__cxx11::string::string(local_200);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe617,in_stack_ffffffffffffe610),
               in_stack_ffffffffffffe608,in_stack_ffffffffffffe600);
    std::function<void(std::__cxx11::string)>::function<main::__0&,void>
              ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                *)CONCAT17(in_stack_ffffffffffffe5e7,in_stack_ffffffffffffe5e0),
               (anon_class_1_0_00000001 *)in_stack_ffffffffffffe5d8);
    bVar1 = pbrt::ParseArg<std::__cxx11::string*>
                      ((char ***)in_stack_ffffffffffffe7b8,
                       (string *)CONCAT17(in_stack_ffffffffffffe7b7,in_stack_ffffffffffffe7b0),
                       in_stack_ffffffffffffe7a8,in_stack_ffffffffffffe7a0);
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                 *)0x430210);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator(&local_221);
    if (bVar1) {
      auVar7 = std::__cxx11::string::operator_cast_to_basic_string_view(local_1c0);
      str._M_str._0_7_ = in_stack_ffffffffffffe688;
      str._M_len = (size_t)in_stack_ffffffffffffe680;
      str._M_str._7_1_ = in_stack_ffffffffffffe68f;
      local_278 = auVar7;
      pbrt::SplitStringToFloats(str,(char)((ulong)in_stack_ffffffffffffe678 >> 0x38));
      bVar1 = pstd::optional::operator_cast_to_bool(local_268);
      if (bVar1) {
        pvVar3 = pstd::optional<std::vector<float,_std::allocator<float>_>_>::operator->
                           ((optional<std::vector<float,_std::allocator<float>_>_> *)0x4302ab);
        sVar5 = std::vector<float,_std::allocator<float>_>::size(pvVar3);
        if (sVar5 != 4) goto LAB_004302cc;
        pvVar3 = pstd::optional<std::vector<float,_std::allocator<float>_>_>::operator*
                           ((optional<std::vector<float,_std::allocator<float>_>_> *)0x430421);
        std::vector<float,_std::allocator<float>_>::operator[](pvVar3,0);
        pvVar3 = pstd::optional<std::vector<float,_std::allocator<float>_>_>::operator*
                           ((optional<std::vector<float,_std::allocator<float>_>_> *)0x430456);
        std::vector<float,_std::allocator<float>_>::operator[](pvVar3,2);
        pbrt::Point2<float>::Point2
                  ((Point2<float> *)
                   CONCAT17(in_stack_ffffffffffffe5d7,
                            CONCAT16(in_stack_ffffffffffffe5d6,
                                     CONCAT15(in_stack_ffffffffffffe5d5,
                                              CONCAT14(in_stack_ffffffffffffe5d4,
                                                       in_stack_ffffffffffffe5d0)))),
                   (float)((ulong)in_stack_ffffffffffffe5c8 >> 0x20),
                   SUB84(in_stack_ffffffffffffe5c8,0));
        pvVar3 = pstd::optional<std::vector<float,_std::allocator<float>_>_>::operator*
                           ((optional<std::vector<float,_std::allocator<float>_>_> *)0x43049b);
        std::vector<float,_std::allocator<float>_>::operator[](pvVar3,1);
        pvVar3 = pstd::optional<std::vector<float,_std::allocator<float>_>_>::operator*
                           ((optional<std::vector<float,_std::allocator<float>_>_> *)0x4304d1);
        std::vector<float,_std::allocator<float>_>::operator[](pvVar3,3);
        pbrt::Point2<float>::Point2
                  ((Point2<float> *)
                   CONCAT17(in_stack_ffffffffffffe5d7,
                            CONCAT16(in_stack_ffffffffffffe5d6,
                                     CONCAT15(in_stack_ffffffffffffe5d5,
                                              CONCAT14(in_stack_ffffffffffffe5d4,
                                                       in_stack_ffffffffffffe5d0)))),
                   (float)((ulong)in_stack_ffffffffffffe5c8 >> 0x20),
                   SUB84(in_stack_ffffffffffffe5c8,0));
        pbrt::Bounds2<float>::Bounds2
                  ((Bounds2<float> *)CONCAT17(in_stack_ffffffffffffe5e7,in_stack_ffffffffffffe5e0),
                   (Point2<float> *)in_stack_ffffffffffffe5d8,
                   (Point2<float> *)
                   CONCAT17(in_stack_ffffffffffffe5d7,
                            CONCAT16(in_stack_ffffffffffffe5d6,
                                     CONCAT15(in_stack_ffffffffffffe5d5,
                                              CONCAT14(in_stack_ffffffffffffe5d4,
                                                       in_stack_ffffffffffffe5d0)))));
        pstd::optional<pbrt::Bounds2<float>_>::operator=
                  ((optional<pbrt::Bounds2<float>_> *)
                   CONCAT17(in_stack_ffffffffffffe5d7,
                            CONCAT16(in_stack_ffffffffffffe5d6,
                                     CONCAT15(in_stack_ffffffffffffe5d5,
                                              CONCAT14(in_stack_ffffffffffffe5d4,
                                                       in_stack_ffffffffffffe5d0)))),
                   (Bounds2<float> *)in_stack_ffffffffffffe5c8);
        local_2a0 = 0;
      }
      else {
LAB_004302cc:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffe617,in_stack_ffffffffffffe610),
                   in_stack_ffffffffffffe608,in_stack_ffffffffffffe600);
        usage((string *)
              CONCAT17(in_stack_ffffffffffffe5d7,
                       CONCAT16(in_stack_ffffffffffffe5d6,
                                CONCAT15(in_stack_ffffffffffffe5d5,
                                         CONCAT14(in_stack_ffffffffffffe5d4,
                                                  in_stack_ffffffffffffe5d0)))));
        std::__cxx11::string::~string(local_298);
        std::allocator<char>::~allocator(&local_299);
        local_4 = 1;
        local_2a0 = 1;
      }
      pstd::optional<std::vector<float,_std::allocator<float>_>_>::~optional
                ((optional<std::vector<float,_std::allocator<float>_>_> *)0x430557);
      local_17f9 = (bool)in_stack_ffffffffffffe5e7;
joined_r0x00430560:
      if (local_2a0 == 0) {
LAB_00432c96:
        local_2a0 = 0;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe617,in_stack_ffffffffffffe610),
                 in_stack_ffffffffffffe608,in_stack_ffffffffffffe600);
      std::function<void(std::__cxx11::string)>::function<main::__0&,void>
                ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  *)CONCAT17(in_stack_ffffffffffffe5e7,in_stack_ffffffffffffe5e0),
                 (anon_class_1_0_00000001 *)in_stack_ffffffffffffe5d8);
      bVar1 = pbrt::ParseArg<std::__cxx11::string*>
                        ((char ***)in_stack_ffffffffffffe7b8,
                         (string *)CONCAT17(in_stack_ffffffffffffe7b7,in_stack_ffffffffffffe7b0),
                         in_stack_ffffffffffffe7a8,in_stack_ffffffffffffe7a0);
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x43060a);
      std::__cxx11::string::~string(local_2e0);
      std::allocator<char>::~allocator(&local_2e1);
      if (bVar1) {
        auVar7 = std::__cxx11::string::operator_cast_to_basic_string_view(local_200);
        str_00._M_str._0_7_ = in_stack_ffffffffffffe688;
        str_00._M_len = (size_t)in_stack_ffffffffffffe680;
        str_00._M_str._7_1_ = in_stack_ffffffffffffe68f;
        local_338 = auVar7;
        pbrt::SplitStringToInts(str_00,(char)((ulong)in_stack_ffffffffffffe678 >> 0x38));
        bVar1 = pstd::optional::operator_cast_to_bool(local_328);
        if (bVar1) {
          pvVar4 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::operator->
                             ((optional<std::vector<int,_std::allocator<int>_>_> *)0x4306a5);
          sVar5 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
          if (sVar5 != 2) goto LAB_004306c6;
          pvVar4 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::operator*
                             ((optional<std::vector<int,_std::allocator<int>_>_> *)0x430802);
          std::vector<int,_std::allocator<int>_>::operator[](pvVar4,0);
          pvVar4 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::operator*
                             ((optional<std::vector<int,_std::allocator<int>_>_> *)0x430833);
          std::vector<int,_std::allocator<int>_>::operator[](pvVar4,1);
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)
                     CONCAT17(in_stack_ffffffffffffe5d7,
                              CONCAT16(in_stack_ffffffffffffe5d6,
                                       CONCAT15(in_stack_ffffffffffffe5d5,
                                                CONCAT14(in_stack_ffffffffffffe5d4,
                                                         in_stack_ffffffffffffe5d0)))),
                     (int)((ulong)in_stack_ffffffffffffe5c8 >> 0x20),(int)in_stack_ffffffffffffe5c8)
          ;
          pvVar4 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::operator*
                             ((optional<std::vector<int,_std::allocator<int>_>_> *)0x430874);
          std::vector<int,_std::allocator<int>_>::operator[](pvVar4,0);
          pvVar4 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::operator*
                             ((optional<std::vector<int,_std::allocator<int>_>_> *)0x4308a7);
          std::vector<int,_std::allocator<int>_>::operator[](pvVar4,1);
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)
                     CONCAT17(in_stack_ffffffffffffe5d7,
                              CONCAT16(in_stack_ffffffffffffe5d6,
                                       CONCAT15(in_stack_ffffffffffffe5d5,
                                                CONCAT14(in_stack_ffffffffffffe5d4,
                                                         in_stack_ffffffffffffe5d0)))),
                     (int)((ulong)in_stack_ffffffffffffe5c8 >> 0x20),(int)in_stack_ffffffffffffe5c8)
          ;
          pbrt::Bounds2<int>::Bounds2
                    ((Bounds2<int> *)CONCAT17(in_stack_ffffffffffffe5e7,in_stack_ffffffffffffe5e0),
                     (Point2<int> *)in_stack_ffffffffffffe5d8,
                     (Point2<int> *)
                     CONCAT17(in_stack_ffffffffffffe5d7,
                              CONCAT16(in_stack_ffffffffffffe5d6,
                                       CONCAT15(in_stack_ffffffffffffe5d5,
                                                CONCAT14(in_stack_ffffffffffffe5d4,
                                                         in_stack_ffffffffffffe5d0)))));
          pstd::optional<pbrt::Bounds2<int>_>::operator=
                    ((optional<pbrt::Bounds2<int>_> *)
                     CONCAT17(in_stack_ffffffffffffe5d7,
                              CONCAT16(in_stack_ffffffffffffe5d6,
                                       CONCAT15(in_stack_ffffffffffffe5d5,
                                                CONCAT14(in_stack_ffffffffffffe5d4,
                                                         in_stack_ffffffffffffe5d0)))),
                     (Bounds2<int> *)in_stack_ffffffffffffe5c8);
          local_2a0 = 0;
        }
        else {
LAB_004306c6:
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffe617,in_stack_ffffffffffffe610),
                     in_stack_ffffffffffffe608,in_stack_ffffffffffffe600);
          usage((string *)
                CONCAT17(in_stack_ffffffffffffe5d7,
                         CONCAT16(in_stack_ffffffffffffe5d6,
                                  CONCAT15(in_stack_ffffffffffffe5d5,
                                           CONCAT14(in_stack_ffffffffffffe5d4,
                                                    in_stack_ffffffffffffe5d0)))));
          std::__cxx11::string::~string(local_358);
          std::allocator<char>::~allocator(&local_359);
          local_4 = 1;
          local_2a0 = 1;
        }
        pstd::optional<std::vector<int,_std::allocator<int>_>_>::~optional
                  ((optional<std::vector<int,_std::allocator<int>_>_> *)0x43092b);
        local_17f9 = (bool)in_stack_ffffffffffffe5e7;
        goto joined_r0x00430560;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe617,in_stack_ffffffffffffe610),
                 in_stack_ffffffffffffe608,in_stack_ffffffffffffe600);
      std::function<void(std::__cxx11::string)>::function<main::__0&,void>
                ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  *)CONCAT17(in_stack_ffffffffffffe5e7,in_stack_ffffffffffffe5e0),
                 (anon_class_1_0_00000001 *)in_stack_ffffffffffffe5d8);
      bVar1 = pbrt::ParseArg<std::__cxx11::string*>
                        ((char ***)in_stack_ffffffffffffe7b8,
                         (string *)CONCAT17(in_stack_ffffffffffffe7b7,in_stack_ffffffffffffe7b0),
                         in_stack_ffffffffffffe7a8,in_stack_ffffffffffffe7a0);
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x4309de);
      std::__cxx11::string::~string(local_3a0);
      std::allocator<char>::~allocator(&local_3a1);
      if (bVar1) {
        auVar7 = std::__cxx11::string::operator_cast_to_basic_string_view(local_1e0);
        str_01._M_str._0_7_ = in_stack_ffffffffffffe688;
        str_01._M_len = (size_t)in_stack_ffffffffffffe680;
        str_01._M_str._7_1_ = in_stack_ffffffffffffe68f;
        local_3f8 = auVar7;
        pbrt::SplitStringToInts(str_01,(char)((ulong)in_stack_ffffffffffffe678 >> 0x38));
        bVar1 = pstd::optional::operator_cast_to_bool(local_3e8);
        if (bVar1) {
          pvVar4 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::operator->
                             ((optional<std::vector<int,_std::allocator<int>_>_> *)0x430a79);
          sVar5 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
          if (sVar5 != 4) goto LAB_00430a9a;
          pvVar4 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::operator*
                             ((optional<std::vector<int,_std::allocator<int>_>_> *)0x430bd6);
          std::vector<int,_std::allocator<int>_>::operator[](pvVar4,0);
          pvVar4 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::operator*
                             ((optional<std::vector<int,_std::allocator<int>_>_> *)0x430c07);
          std::vector<int,_std::allocator<int>_>::operator[](pvVar4,2);
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)
                     CONCAT17(in_stack_ffffffffffffe5d7,
                              CONCAT16(in_stack_ffffffffffffe5d6,
                                       CONCAT15(in_stack_ffffffffffffe5d5,
                                                CONCAT14(in_stack_ffffffffffffe5d4,
                                                         in_stack_ffffffffffffe5d0)))),
                     (int)((ulong)in_stack_ffffffffffffe5c8 >> 0x20),(int)in_stack_ffffffffffffe5c8)
          ;
          pvVar4 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::operator*
                             ((optional<std::vector<int,_std::allocator<int>_>_> *)0x430c48);
          std::vector<int,_std::allocator<int>_>::operator[](pvVar4,1);
          pvVar4 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::operator*
                             ((optional<std::vector<int,_std::allocator<int>_>_> *)0x430c7a);
          std::vector<int,_std::allocator<int>_>::operator[](pvVar4,3);
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)
                     CONCAT17(in_stack_ffffffffffffe5d7,
                              CONCAT16(in_stack_ffffffffffffe5d6,
                                       CONCAT15(in_stack_ffffffffffffe5d5,
                                                CONCAT14(in_stack_ffffffffffffe5d4,
                                                         in_stack_ffffffffffffe5d0)))),
                     (int)((ulong)in_stack_ffffffffffffe5c8 >> 0x20),(int)in_stack_ffffffffffffe5c8)
          ;
          pbrt::Bounds2<int>::Bounds2
                    ((Bounds2<int> *)CONCAT17(in_stack_ffffffffffffe5e7,in_stack_ffffffffffffe5e0),
                     (Point2<int> *)in_stack_ffffffffffffe5d8,
                     (Point2<int> *)
                     CONCAT17(in_stack_ffffffffffffe5d7,
                              CONCAT16(in_stack_ffffffffffffe5d6,
                                       CONCAT15(in_stack_ffffffffffffe5d5,
                                                CONCAT14(in_stack_ffffffffffffe5d4,
                                                         in_stack_ffffffffffffe5d0)))));
          pstd::optional<pbrt::Bounds2<int>_>::operator=
                    ((optional<pbrt::Bounds2<int>_> *)
                     CONCAT17(in_stack_ffffffffffffe5d7,
                              CONCAT16(in_stack_ffffffffffffe5d6,
                                       CONCAT15(in_stack_ffffffffffffe5d5,
                                                CONCAT14(in_stack_ffffffffffffe5d4,
                                                         in_stack_ffffffffffffe5d0)))),
                     (Bounds2<int> *)in_stack_ffffffffffffe5c8);
          local_2a0 = 0;
        }
        else {
LAB_00430a9a:
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffe617,in_stack_ffffffffffffe610),
                     in_stack_ffffffffffffe608,in_stack_ffffffffffffe600);
          usage((string *)
                CONCAT17(in_stack_ffffffffffffe5d7,
                         CONCAT16(in_stack_ffffffffffffe5d6,
                                  CONCAT15(in_stack_ffffffffffffe5d5,
                                           CONCAT14(in_stack_ffffffffffffe5d4,
                                                    in_stack_ffffffffffffe5d0)))));
          std::__cxx11::string::~string(local_418);
          std::allocator<char>::~allocator(&local_419);
          local_4 = 1;
          local_2a0 = 1;
        }
        pstd::optional<std::vector<int,_std::allocator<int>_>_>::~optional
                  ((optional<std::vector<int,_std::allocator<int>_>_> *)0x430cfc);
        local_17f9 = (bool)in_stack_ffffffffffffe5e7;
        goto joined_r0x00430560;
      }
      std::allocator<char>::allocator();
      local_4aa = 0;
      local_4ab = 0;
      local_4d1 = 0;
      local_4fa = 0;
      local_4fb = 0;
      local_521 = 0;
      local_54a = 0;
      local_54b = 0;
      local_571 = 0;
      local_59a = 0;
      local_59b = 0;
      local_5c1 = 0;
      local_5ea = 0;
      local_5eb = 0;
      local_611 = 0;
      local_63a = 0;
      local_63b = 0;
      local_661 = 0;
      local_68a = 0;
      local_68b = 0;
      local_6b1 = 0;
      local_6da = 0;
      local_6db = 0;
      local_701 = 0;
      local_72a = 0;
      local_72b = 0;
      local_751 = 0;
      local_77a = 0;
      local_77b = 0;
      local_7a1 = 0;
      local_7ca = 0;
      local_7cb = 0;
      local_7f1 = 0;
      local_81a = 0;
      local_81b = 0;
      local_841 = 0;
      local_86a = 0;
      local_86b = 0;
      local_891 = 0;
      local_8ba = 0;
      local_8bb = 0;
      local_8e1 = 0;
      local_90a = 0;
      local_90b = 0;
      local_931 = 0;
      local_95a = 0;
      local_95b = 0;
      local_981 = 0;
      local_9aa = 0;
      local_9ab = 0;
      local_9d1 = 0;
      local_9fa = 0;
      local_9fb = 0;
      local_a21 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe617,in_stack_ffffffffffffe610),
                 in_stack_ffffffffffffe608,in_stack_ffffffffffffe600);
      std::function<void(std::__cxx11::string)>::function<main::__0&,void>
                ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  *)CONCAT17(in_stack_ffffffffffffe5e7,in_stack_ffffffffffffe5e0),
                 (anon_class_1_0_00000001 *)in_stack_ffffffffffffe5d8);
      bVar1 = pbrt::ParseArg<std::__cxx11::string*>
                        ((char ***)in_stack_ffffffffffffe7b8,
                         (string *)CONCAT17(in_stack_ffffffffffffe7b7,in_stack_ffffffffffffe7b0),
                         in_stack_ffffffffffffe7a8,in_stack_ffffffffffffe7a0);
      local_17f9 = true;
      if (!bVar1) {
        std::allocator<char>::allocator();
        local_4aa = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffe617,in_stack_ffffffffffffe610),
                   in_stack_ffffffffffffe608,in_stack_ffffffffffffe600);
        local_4ab = 1;
        std::function<void(std::__cxx11::string)>::function<main::__0&,void>
                  ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                    *)CONCAT17(in_stack_ffffffffffffe5e7,in_stack_ffffffffffffe5e0),
                   (anon_class_1_0_00000001 *)in_stack_ffffffffffffe5d8);
        local_4d1 = 1;
        bVar1 = pbrt::ParseArg<bool*>
                          ((char ***)in_stack_ffffffffffffe7b8,
                           (string *)CONCAT17(in_stack_ffffffffffffe7b7,in_stack_ffffffffffffe7b0),
                           (bool *)in_stack_ffffffffffffe7a8,in_stack_ffffffffffffe7a0);
        local_17f9 = true;
        if (!bVar1) {
          std::allocator<char>::allocator();
          local_4fa = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffe617,in_stack_ffffffffffffe610),
                     in_stack_ffffffffffffe608,in_stack_ffffffffffffe600);
          local_4fb = 1;
          std::function<void(std::__cxx11::string)>::function<main::__0&,void>
                    ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                      *)CONCAT17(in_stack_ffffffffffffe5e7,in_stack_ffffffffffffe5e0),
                     (anon_class_1_0_00000001 *)in_stack_ffffffffffffe5d8);
          local_521 = 1;
          bVar1 = pbrt::ParseArg<bool*>
                            ((char ***)in_stack_ffffffffffffe7b8,
                             (string *)CONCAT17(in_stack_ffffffffffffe7b7,in_stack_ffffffffffffe7b0)
                             ,(bool *)in_stack_ffffffffffffe7a8,in_stack_ffffffffffffe7a0);
          local_17f9 = true;
          if (!bVar1) {
            in_stack_ffffffffffffe7b8 = &local_549;
            std::allocator<char>::allocator();
            local_54a = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffe617,in_stack_ffffffffffffe610),
                       in_stack_ffffffffffffe608,in_stack_ffffffffffffe600);
            local_54b = 1;
            in_stack_ffffffffffffe7a0 = local_58;
            in_stack_ffffffffffffe7a8 = &local_570;
            std::function<void(std::__cxx11::string)>::function<main::__0&,void>
                      ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)CONCAT17(in_stack_ffffffffffffe5e7,in_stack_ffffffffffffe5e0),
                       (anon_class_1_0_00000001 *)in_stack_ffffffffffffe5d8);
            local_571 = 1;
            in_stack_ffffffffffffe7b7 =
                 pbrt::ParseArg<std::__cxx11::string*>
                           ((char ***)in_stack_ffffffffffffe7b8,
                            (string *)CONCAT17(in_stack_ffffffffffffe7b7,in_stack_ffffffffffffe7b0),
                            in_stack_ffffffffffffe7a8,in_stack_ffffffffffffe7a0);
            local_17f9 = true;
            if (!(bool)in_stack_ffffffffffffe7b7) {
              std::allocator<char>::allocator();
              local_59a = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffe617,in_stack_ffffffffffffe610),
                         in_stack_ffffffffffffe608,in_stack_ffffffffffffe600);
              local_59b = 1;
              std::function<void(std::__cxx11::string)>::function<main::__0&,void>
                        ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)CONCAT17(in_stack_ffffffffffffe5e7,in_stack_ffffffffffffe5e0),
                         (anon_class_1_0_00000001 *)in_stack_ffffffffffffe5d8);
              local_5c1 = 1;
              bVar1 = pbrt::ParseArg<bool*>
                                ((char ***)in_stack_ffffffffffffe7b8,
                                 (string *)
                                 CONCAT17(in_stack_ffffffffffffe7b7,in_stack_ffffffffffffe7b0),
                                 (bool *)in_stack_ffffffffffffe7a8,in_stack_ffffffffffffe7a0);
              local_17f9 = true;
              if (!bVar1) {
                std::allocator<char>::allocator();
                local_5ea = 1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_ffffffffffffe617,in_stack_ffffffffffffe610),
                           in_stack_ffffffffffffe608,in_stack_ffffffffffffe600);
                local_5eb = 1;
                std::function<void(std::__cxx11::string)>::function<main::__0&,void>
                          ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                            *)CONCAT17(in_stack_ffffffffffffe5e7,in_stack_ffffffffffffe5e0),
                           (anon_class_1_0_00000001 *)in_stack_ffffffffffffe5d8);
                local_611 = 1;
                bVar1 = pbrt::ParseArg<bool*>
                                  ((char ***)in_stack_ffffffffffffe7b8,
                                   (string *)
                                   CONCAT17(in_stack_ffffffffffffe7b7,in_stack_ffffffffffffe7b0),
                                   (bool *)in_stack_ffffffffffffe7a8,in_stack_ffffffffffffe7a0);
                local_17f9 = true;
                if (!bVar1) {
                  std::allocator<char>::allocator();
                  local_63a = 1;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_ffffffffffffe617,in_stack_ffffffffffffe610),
                             in_stack_ffffffffffffe608,in_stack_ffffffffffffe600);
                  local_63b = 1;
                  std::function<void(std::__cxx11::string)>::function<main::__0&,void>
                            ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                              *)CONCAT17(in_stack_ffffffffffffe5e7,in_stack_ffffffffffffe5e0),
                             (anon_class_1_0_00000001 *)in_stack_ffffffffffffe5d8);
                  local_661 = 1;
                  bVar1 = pbrt::ParseArg<std::__cxx11::string*>
                                    ((char ***)in_stack_ffffffffffffe7b8,
                                     (string *)
                                     CONCAT17(in_stack_ffffffffffffe7b7,in_stack_ffffffffffffe7b0),
                                     in_stack_ffffffffffffe7a8,in_stack_ffffffffffffe7a0);
                  local_17f9 = true;
                  if (!bVar1) {
                    std::allocator<char>::allocator();
                    local_68a = 1;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_ffffffffffffe617,in_stack_ffffffffffffe610),
                               in_stack_ffffffffffffe608,in_stack_ffffffffffffe600);
                    local_68b = 1;
                    std::function<void(std::__cxx11::string)>::function<main::__0&,void>
                              ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                *)CONCAT17(in_stack_ffffffffffffe5e7,in_stack_ffffffffffffe5e0),
                               (anon_class_1_0_00000001 *)in_stack_ffffffffffffe5d8);
                    local_6b1 = 1;
                    bVar1 = pbrt::ParseArg<std::__cxx11::string*>
                                      ((char ***)in_stack_ffffffffffffe7b8,
                                       (string *)
                                       CONCAT17(in_stack_ffffffffffffe7b7,in_stack_ffffffffffffe7b0)
                                       ,in_stack_ffffffffffffe7a8,in_stack_ffffffffffffe7a0);
                    local_17f9 = true;
                    if (!bVar1) {
                      std::allocator<char>::allocator();
                      local_6da = 1;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_ffffffffffffe617,in_stack_ffffffffffffe610),
                                 in_stack_ffffffffffffe608,in_stack_ffffffffffffe600);
                      local_6db = 1;
                      std::function<void(std::__cxx11::string)>::function<main::__0&,void>
                                ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                  *)CONCAT17(in_stack_ffffffffffffe5e7,in_stack_ffffffffffffe5e0),
                                 (anon_class_1_0_00000001 *)in_stack_ffffffffffffe5d8);
                      local_701 = 1;
                      bVar1 = pbrt::ParseArg<std::__cxx11::string*>
                                        ((char ***)in_stack_ffffffffffffe7b8,
                                         (string *)
                                         CONCAT17(in_stack_ffffffffffffe7b7,
                                                  in_stack_ffffffffffffe7b0),
                                         in_stack_ffffffffffffe7a8,in_stack_ffffffffffffe7a0);
                      local_17f9 = true;
                      if (!bVar1) {
                        std::allocator<char>::allocator();
                        local_72a = 1;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_ffffffffffffe617,in_stack_ffffffffffffe610),
                                   in_stack_ffffffffffffe608,in_stack_ffffffffffffe600);
                        local_72b = 1;
                        std::function<void(std::__cxx11::string)>::function<main::__0&,void>
                                  ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                    *)CONCAT17(in_stack_ffffffffffffe5e7,in_stack_ffffffffffffe5e0),
                                   (anon_class_1_0_00000001 *)in_stack_ffffffffffffe5d8);
                        local_751 = 1;
                        bVar1 = pbrt::ParseArg<int*>
                                          ((char ***)in_stack_ffffffffffffe7b8,
                                           (string *)
                                           CONCAT17(in_stack_ffffffffffffe7b7,
                                                    in_stack_ffffffffffffe7b0),
                                           (int *)in_stack_ffffffffffffe7a8,
                                           in_stack_ffffffffffffe7a0);
                        local_17f9 = true;
                        if (!bVar1) {
                          std::allocator<char>::allocator();
                          local_77a = 1;
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(in_stack_ffffffffffffe617,in_stack_ffffffffffffe610
                                                ),in_stack_ffffffffffffe608,
                                     in_stack_ffffffffffffe600);
                          local_77b = 1;
                          std::function<void(std::__cxx11::string)>::function<main::__0&,void>
                                    ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                      *)CONCAT17(in_stack_ffffffffffffe5e7,in_stack_ffffffffffffe5e0
                                                ),
                                     (anon_class_1_0_00000001 *)in_stack_ffffffffffffe5d8);
                          local_7a1 = 1;
                          bVar1 = pbrt::ParseArg<std::__cxx11::string*>
                                            ((char ***)in_stack_ffffffffffffe7b8,
                                             (string *)
                                             CONCAT17(in_stack_ffffffffffffe7b7,
                                                      in_stack_ffffffffffffe7b0),
                                             in_stack_ffffffffffffe7a8,in_stack_ffffffffffffe7a0);
                          local_17f9 = true;
                          if (!bVar1) {
                            in_stack_ffffffffffffe6d0 = &local_7c9;
                            std::allocator<char>::allocator();
                            local_7ca = 1;
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT17(in_stack_ffffffffffffe617,
                                                   in_stack_ffffffffffffe610),
                                       in_stack_ffffffffffffe608,in_stack_ffffffffffffe600);
                            local_7cb = 1;
                            in_stack_ffffffffffffe6c0 = local_7f0;
                            std::function<void(std::__cxx11::string)>::function<main::__0&,void>
                                      ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                        *)CONCAT17(in_stack_ffffffffffffe5e7,
                                                   in_stack_ffffffffffffe5e0),
                                       (anon_class_1_0_00000001 *)in_stack_ffffffffffffe5d8);
                            local_7f1 = 1;
                            in_stack_ffffffffffffe6cf =
                                 pbrt::ParseArg<bool*>
                                           ((char ***)in_stack_ffffffffffffe7b8,
                                            (string *)
                                            CONCAT17(in_stack_ffffffffffffe7b7,
                                                     in_stack_ffffffffffffe7b0),
                                            (bool *)in_stack_ffffffffffffe7a8,
                                            in_stack_ffffffffffffe7a0);
                            local_17f9 = true;
                            if (!(bool)in_stack_ffffffffffffe6cf) {
                              std::allocator<char>::allocator();
                              local_81a = 1;
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT17(in_stack_ffffffffffffe617,
                                                     in_stack_ffffffffffffe610),
                                         in_stack_ffffffffffffe608,in_stack_ffffffffffffe600);
                              local_81b = 1;
                              std::function<void(std::__cxx11::string)>::function<main::__0&,void>
                                        ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                          *)CONCAT17(in_stack_ffffffffffffe5e7,
                                                     in_stack_ffffffffffffe5e0),
                                         (anon_class_1_0_00000001 *)in_stack_ffffffffffffe5d8);
                              local_841 = 1;
                              bVar1 = pbrt::ParseArg<bool*>
                                                ((char ***)in_stack_ffffffffffffe7b8,
                                                 (string *)
                                                 CONCAT17(in_stack_ffffffffffffe7b7,
                                                          in_stack_ffffffffffffe7b0),
                                                 (bool *)in_stack_ffffffffffffe7a8,
                                                 in_stack_ffffffffffffe7a0);
                              local_17f9 = true;
                              if (!bVar1) {
                                std::allocator<char>::allocator();
                                local_86a = 1;
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)CONCAT17(in_stack_ffffffffffffe617,
                                                       in_stack_ffffffffffffe610),
                                           in_stack_ffffffffffffe608,in_stack_ffffffffffffe600);
                                local_86b = 1;
                                in_stack_ffffffffffffe678 = local_f7;
                                in_stack_ffffffffffffe680 = local_890;
                                std::function<void(std::__cxx11::string)>::function<main::__0&,void>
                                          ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                            *)CONCAT17(in_stack_ffffffffffffe5e7,
                                                       in_stack_ffffffffffffe5e0),
                                           (anon_class_1_0_00000001 *)in_stack_ffffffffffffe5d8);
                                local_891 = 1;
                                in_stack_ffffffffffffe68f =
                                     pbrt::ParseArg<bool*>
                                               ((char ***)in_stack_ffffffffffffe7b8,
                                                (string *)
                                                CONCAT17(in_stack_ffffffffffffe7b7,
                                                         in_stack_ffffffffffffe7b0),
                                                (bool *)in_stack_ffffffffffffe7a8,
                                                in_stack_ffffffffffffe7a0);
                                local_17f9 = true;
                                if (!(bool)in_stack_ffffffffffffe68f) {
                                  std::allocator<char>::allocator();
                                  local_8ba = 1;
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)CONCAT17(in_stack_ffffffffffffe617,
                                                         in_stack_ffffffffffffe610),
                                             in_stack_ffffffffffffe608,in_stack_ffffffffffffe600);
                                  local_8bb = 1;
                                  std::function<void(std::__cxx11::string)>::
                                  function<main::__0&,void>
                                            ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                              *)CONCAT17(in_stack_ffffffffffffe5e7,
                                                         in_stack_ffffffffffffe5e0),
                                             (anon_class_1_0_00000001 *)in_stack_ffffffffffffe5d8);
                                  local_8e1 = 1;
                                  bVar1 = pbrt::ParseArg<std::__cxx11::string*>
                                                    ((char ***)in_stack_ffffffffffffe7b8,
                                                     (string *)
                                                     CONCAT17(in_stack_ffffffffffffe7b7,
                                                              in_stack_ffffffffffffe7b0),
                                                     in_stack_ffffffffffffe7a8,
                                                     in_stack_ffffffffffffe7a0);
                                  local_17f9 = true;
                                  if (!bVar1) {
                                    std::allocator<char>::allocator();
                                    local_90a = 1;
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)CONCAT17(in_stack_ffffffffffffe617,
                                                           in_stack_ffffffffffffe610),
                                               in_stack_ffffffffffffe608,in_stack_ffffffffffffe600);
                                    local_90b = 1;
                                    std::function<void(std::__cxx11::string)>::
                                    function<main::__0&,void>
                                              ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                *)CONCAT17(in_stack_ffffffffffffe5e7,
                                                           in_stack_ffffffffffffe5e0),
                                               (anon_class_1_0_00000001 *)in_stack_ffffffffffffe5d8)
                                    ;
                                    local_931 = 1;
                                    bVar1 = pbrt::ParseArg<int*>
                                                      ((char ***)in_stack_ffffffffffffe7b8,
                                                       (string *)
                                                       CONCAT17(in_stack_ffffffffffffe7b7,
                                                                in_stack_ffffffffffffe7b0),
                                                       (int *)in_stack_ffffffffffffe7a8,
                                                       in_stack_ffffffffffffe7a0);
                                    local_17f9 = true;
                                    if (!bVar1) {
                                      std::allocator<char>::allocator();
                                      local_95a = 1;
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_ffffffffffffe617,
                                                             in_stack_ffffffffffffe610),
                                                 in_stack_ffffffffffffe608,in_stack_ffffffffffffe600
                                                );
                                      local_95b = 1;
                                      in_stack_ffffffffffffe620 = local_e8;
                                      in_stack_ffffffffffffe628 = local_980;
                                      std::function<void(std::__cxx11::string)>::
                                      function<main::__0&,void>
                                                ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)CONCAT17(in_stack_ffffffffffffe5e7,
                                                             in_stack_ffffffffffffe5e0),
                                                 (anon_class_1_0_00000001 *)
                                                 in_stack_ffffffffffffe5d8);
                                      local_981 = 1;
                                      bVar1 = pbrt::ParseArg<pstd::optional<int>*>
                                                        ((char ***)in_stack_ffffffffffffe7b8,
                                                         (string *)
                                                         CONCAT17(in_stack_ffffffffffffe7b7,
                                                                  in_stack_ffffffffffffe7b0),
                                                         (optional<int> *)in_stack_ffffffffffffe7a8,
                                                         in_stack_ffffffffffffe7a0);
                                      in_stack_ffffffffffffe634 =
                                           CONCAT13(bVar1,(int3)in_stack_ffffffffffffe634);
                                      local_17f9 = true;
                                      if (!bVar1) {
                                        in_stack_ffffffffffffe618 = &local_9a9;
                                        std::allocator<char>::allocator();
                                        local_9aa = 1;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_ffffffffffffe617,
                                                             in_stack_ffffffffffffe610),
                                                  in_stack_ffffffffffffe608,
                                                  in_stack_ffffffffffffe600);
                                        local_9ab = 1;
                                        in_stack_ffffffffffffe608 = local_9d0;
                                        std::function<void(std::__cxx11::string)>::
                                        function<main::__0&,void>
                                                  ((
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)CONCAT17(in_stack_ffffffffffffe5e7,
                                                             in_stack_ffffffffffffe5e0),
                                                  (anon_class_1_0_00000001 *)
                                                  in_stack_ffffffffffffe5d8);
                                        local_9d1 = 1;
                                        in_stack_ffffffffffffe617 =
                                             pbrt::ParseArg<bool*>
                                                       ((char ***)in_stack_ffffffffffffe7b8,
                                                        (string *)
                                                        CONCAT17(in_stack_ffffffffffffe7b7,
                                                                 in_stack_ffffffffffffe7b0),
                                                        (bool *)in_stack_ffffffffffffe7a8,
                                                        in_stack_ffffffffffffe7a0);
                                        local_17f9 = true;
                                        if (!(bool)in_stack_ffffffffffffe617) {
                                          in_stack_ffffffffffffe600 = &local_9f9;
                                          std::allocator<char>::allocator();
                                          local_9fa = 1;
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_ffffffffffffe617,
                                                             in_stack_ffffffffffffe610),
                                                  in_stack_ffffffffffffe608,
                                                  in_stack_ffffffffffffe600);
                                          local_9fb = 1;
                                          in_stack_ffffffffffffe5f0 = local_a20;
                                          std::function<void(std::__cxx11::string)>::
                                          function<main::__0&,void>
                                                    ((
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)CONCAT17(in_stack_ffffffffffffe5e7,
                                                             in_stack_ffffffffffffe5e0),
                                                  (anon_class_1_0_00000001 *)
                                                  in_stack_ffffffffffffe5d8);
                                          local_a21 = 1;
                                          in_stack_ffffffffffffe5ff =
                                               pbrt::ParseArg<bool*>
                                                         ((char ***)in_stack_ffffffffffffe7b8,
                                                          (string *)
                                                          CONCAT17(in_stack_ffffffffffffe7b7,
                                                                   in_stack_ffffffffffffe7b0),
                                                          (bool *)in_stack_ffffffffffffe7a8,
                                                          in_stack_ffffffffffffe7a0);
                                          local_17f9 = (bool)in_stack_ffffffffffffe5ff;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if ((local_a21 & 1) != 0) {
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                     *)0x431c90);
      }
      if ((local_9fb & 1) != 0) {
        std::__cxx11::string::~string(local_9f8);
      }
      if ((local_9fa & 1) != 0) {
        std::allocator<char>::~allocator(&local_9f9);
      }
      if ((local_9d1 & 1) != 0) {
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                     *)0x431cdb);
      }
      if ((local_9ab & 1) != 0) {
        std::__cxx11::string::~string(local_9a8);
      }
      if ((local_9aa & 1) != 0) {
        std::allocator<char>::~allocator(&local_9a9);
      }
      if ((local_981 & 1) != 0) {
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                     *)0x431d26);
      }
      if ((local_95b & 1) != 0) {
        std::__cxx11::string::~string(local_958);
      }
      if ((local_95a & 1) != 0) {
        std::allocator<char>::~allocator(&local_959);
      }
      if ((local_931 & 1) != 0) {
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                     *)0x431d71);
      }
      if ((local_90b & 1) != 0) {
        std::__cxx11::string::~string(local_908);
      }
      if ((local_90a & 1) != 0) {
        std::allocator<char>::~allocator(&local_909);
      }
      if ((local_8e1 & 1) != 0) {
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                     *)0x431dbc);
      }
      if ((local_8bb & 1) != 0) {
        std::__cxx11::string::~string(local_8b8);
      }
      if ((local_8ba & 1) != 0) {
        std::allocator<char>::~allocator(&local_8b9);
      }
      if ((local_891 & 1) != 0) {
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                     *)0x431e07);
      }
      if ((local_86b & 1) != 0) {
        std::__cxx11::string::~string(local_868);
      }
      if ((local_86a & 1) != 0) {
        std::allocator<char>::~allocator(&local_869);
      }
      if ((local_841 & 1) != 0) {
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                     *)0x431e52);
      }
      if ((local_81b & 1) != 0) {
        std::__cxx11::string::~string(local_818);
      }
      if ((local_81a & 1) != 0) {
        std::allocator<char>::~allocator(&local_819);
      }
      if ((local_7f1 & 1) != 0) {
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                     *)0x431e9d);
      }
      if ((local_7cb & 1) != 0) {
        std::__cxx11::string::~string(local_7c8);
      }
      if ((local_7ca & 1) != 0) {
        std::allocator<char>::~allocator(&local_7c9);
      }
      if ((local_7a1 & 1) != 0) {
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                     *)0x431ee8);
      }
      if ((local_77b & 1) != 0) {
        std::__cxx11::string::~string(local_778);
      }
      if ((local_77a & 1) != 0) {
        std::allocator<char>::~allocator(&local_779);
      }
      if ((local_751 & 1) != 0) {
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                     *)0x431f33);
      }
      if ((local_72b & 1) != 0) {
        std::__cxx11::string::~string(local_728);
      }
      if ((local_72a & 1) != 0) {
        std::allocator<char>::~allocator(&local_729);
      }
      if ((local_701 & 1) != 0) {
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                     *)0x431f7e);
      }
      if ((local_6db & 1) != 0) {
        std::__cxx11::string::~string(local_6d8);
      }
      if ((local_6da & 1) != 0) {
        std::allocator<char>::~allocator(&local_6d9);
      }
      if ((local_6b1 & 1) != 0) {
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                     *)0x431fc9);
      }
      if ((local_68b & 1) != 0) {
        std::__cxx11::string::~string(local_688);
      }
      if ((local_68a & 1) != 0) {
        std::allocator<char>::~allocator(&local_689);
      }
      if ((local_661 & 1) != 0) {
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                     *)0x432014);
      }
      if ((local_63b & 1) != 0) {
        std::__cxx11::string::~string(local_638);
      }
      if ((local_63a & 1) != 0) {
        std::allocator<char>::~allocator(&local_639);
      }
      if ((local_611 & 1) != 0) {
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                     *)0x43205f);
      }
      if ((local_5eb & 1) != 0) {
        std::__cxx11::string::~string(local_5e8);
      }
      if ((local_5ea & 1) != 0) {
        std::allocator<char>::~allocator(&local_5e9);
      }
      if ((local_5c1 & 1) != 0) {
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                     *)0x4320aa);
      }
      if ((local_59b & 1) != 0) {
        std::__cxx11::string::~string(local_598);
      }
      if ((local_59a & 1) != 0) {
        std::allocator<char>::~allocator(&local_599);
      }
      if ((local_571 & 1) != 0) {
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                     *)0x4320f5);
      }
      if ((local_54b & 1) != 0) {
        std::__cxx11::string::~string(local_548);
      }
      if ((local_54a & 1) != 0) {
        std::allocator<char>::~allocator(&local_549);
      }
      if ((local_521 & 1) != 0) {
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                     *)0x432140);
      }
      if ((local_4fb & 1) != 0) {
        std::__cxx11::string::~string(local_4f8);
      }
      if ((local_4fa & 1) != 0) {
        std::allocator<char>::~allocator(&local_4f9);
      }
      if ((local_4d1 & 1) != 0) {
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                     *)0x43218b);
      }
      if ((local_4ab & 1) != 0) {
        std::__cxx11::string::~string(local_4a8);
      }
      if ((local_4aa & 1) != 0) {
        std::allocator<char>::~allocator(&local_4a9);
      }
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x4321ca);
      std::__cxx11::string::~string(local_460);
      std::allocator<char>::~allocator(&local_461);
      if ((local_17f9 & 1U) != 0) goto LAB_00432c96;
      iVar2 = strcmp((char *)*local_10,"--help");
      if (iVar2 == 0) {
LAB_00432baf:
        in_stack_ffffffffffffe5d8 = local_a48;
        std::__cxx11::string::string(in_stack_ffffffffffffe5d8);
        usage((string *)
              CONCAT17(in_stack_ffffffffffffe5d7,
                       CONCAT16(in_stack_ffffffffffffe5d6,
                                CONCAT15(in_stack_ffffffffffffe5d5,
                                         CONCAT14(in_stack_ffffffffffffe5d4,
                                                  in_stack_ffffffffffffe5d0)))));
        std::__cxx11::string::~string(local_a48);
        local_4 = 0;
        local_2a0 = 1;
      }
      else {
        iVar2 = strcmp((char *)*local_10,"-help");
        if (iVar2 == 0) goto LAB_00432baf;
        iVar2 = strcmp((char *)*local_10,"-h");
        if (iVar2 == 0) goto LAB_00432baf;
        pbrt::StringPrintf<char*&>
                  ((char *)CONCAT17(in_stack_ffffffffffffe5ff,in_stack_ffffffffffffe5f8),
                   in_stack_ffffffffffffe5f0);
        usage((string *)
              CONCAT17(in_stack_ffffffffffffe5d7,
                       CONCAT16(in_stack_ffffffffffffe5d6,
                                CONCAT15(in_stack_ffffffffffffe5d5,
                                         CONCAT14(in_stack_ffffffffffffe5d4,
                                                  in_stack_ffffffffffffe5d0)))));
        std::__cxx11::string::~string(local_a68);
        local_4 = 1;
        local_2a0 = 1;
      }
    }
    std::__cxx11::string::~string(local_200);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::string::~string(local_1c0);
    in_stack_ffffffffffffe5e7 = local_17f9;
  } while (local_2a0 == 0);
LAB_004330c2:
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_138);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(local_17f9,in_stack_ffffffffffffe5e0));
  pbrt::PBRTOptions::~PBRTOptions
            ((PBRTOptions *)
             CONCAT17(in_stack_ffffffffffffe5d7,
                      CONCAT16(in_stack_ffffffffffffe5d6,
                               CONCAT15(in_stack_ffffffffffffe5d5,
                                        CONCAT14(in_stack_ffffffffffffe5d4,in_stack_ffffffffffffe5d0
                                                )))));
  return local_4;
}

Assistant:

int main(int argc, char *argv[]) {
#ifdef NVTX
#ifdef PBRT_IS_WINDOWS
    nvtxNameOsThread(GetCurrentThreadId(), "MAIN_THREAD");
#else
    nvtxNameOsThread(syscall(SYS_gettid), "MAIN_THREAD");
#endif
#endif  // NVTX

    // Declare variables for parsed command line
    PBRTOptions options;
    std::vector<std::string> filenames;
    std::string logLevel = "error";
    std::string renderCoordSys = "cameraworld";
    bool format = false, toPly = false;

    // Process command-line arguments
    ++argv;
    while (*argv != nullptr) {
        if ((*argv)[0] != '-') {
            filenames.push_back(*argv);
            ++argv;
            continue;
        }

        auto onError = [](const std::string &err) {
            usage(err);
            exit(1);
        };

        std::string cropWindow, pixelBounds, pixel;
        if (ParseArg(&argv, "cropwindow", &cropWindow, onError)) {
            pstd::optional<std::vector<Float>> c = SplitStringToFloats(cropWindow, ',');
            if (!c || c->size() != 4) {
                usage("Didn't find four values after --cropwindow");
                return 1;
            }
            options.cropWindow =
                Bounds2f(Point2f((*c)[0], (*c)[2]), Point2f((*c)[1], (*c)[3]));
        } else if (ParseArg(&argv, "pixel", &pixel, onError)) {
            pstd::optional<std::vector<int>> p = SplitStringToInts(pixel, ',');
            if (!p || p->size() != 2) {
                usage("Didn't find two values after --pixel");
                return 1;
            }
            options.pixelBounds =
                Bounds2i(Point2i((*p)[0], (*p)[1]), Point2i((*p)[0] + 1, (*p)[1] + 1));
        } else if (ParseArg(&argv, "pixelbounds", &pixelBounds, onError)) {
            pstd::optional<std::vector<int>> p = SplitStringToInts(pixelBounds, ',');
            if (!p || p->size() != 4) {
                usage("Didn't find four integer values after --pixelbounds");
                return 1;
            }
            options.pixelBounds =
                Bounds2i(Point2i((*p)[0], (*p)[2]), Point2i((*p)[1], (*p)[3]));
        } else if (
#ifdef PBRT_BUILD_GPU_RENDERER
            ParseArg(&argv, "gpu", &options.useGPU, onError) ||
            ParseArg(&argv, "gpu-device", &options.gpuDevice, onError) ||
#endif
            ParseArg(&argv, "debugstart", &options.debugStart, onError) ||
            ParseArg(&argv, "disable-pixel-jitter", &options.disablePixelJitter,
                     onError) ||
            ParseArg(&argv, "disable-wavelength-jitter", &options.disableWavelengthJitter,
                     onError) ||
            ParseArg(&argv, "display-server", &options.displayServer, onError) ||
            ParseArg(&argv, "force-diffuse", &options.forceDiffuse, onError) ||
            ParseArg(&argv, "format", &format, onError) ||
            ParseArg(&argv, "log-level", &logLevel, onError) ||
            ParseArg(&argv, "mse-reference-image", &options.mseReferenceImage, onError) ||
            ParseArg(&argv, "mse-reference-out", &options.mseReferenceOutput, onError) ||
            ParseArg(&argv, "nthreads", &options.nThreads, onError) ||
            ParseArg(&argv, "outfile", &options.imageFile, onError) ||
            ParseArg(&argv, "pixelstats", &options.recordPixelStatistics, onError) ||
            ParseArg(&argv, "quick", &options.quickRender, onError) ||
            ParseArg(&argv, "quiet", &options.quiet, onError) ||
            ParseArg(&argv, "render-coord-sys", &renderCoordSys, onError) ||
            ParseArg(&argv, "seed", &options.seed, onError) ||
            ParseArg(&argv, "spp", &options.pixelSamples, onError) ||
            ParseArg(&argv, "toply", &toPly, onError) ||
            ParseArg(&argv, "upgrade", &options.upgrade, onError)) {
            // success
        } else if ((strcmp(*argv, "--help") == 0) || (strcmp(*argv, "-help") == 0) ||
                   (strcmp(*argv, "-h") == 0)) {
            usage();
            return 0;
        } else {
            usage(StringPrintf("argument \"%s\" unknown", *argv));
            return 1;
        }
    }

    // Print welcome banner
    if (!options.quiet && !format && !toPly && !options.upgrade) {
        printf("pbrt version 4 (built %s at %s)\n", __DATE__, __TIME__);
#ifndef NDEBUG
        LOG_VERBOSE("Running debug build");
        printf("*** DEBUG BUILD ***\n");
#endif  // !NDEBUG
        printf("Copyright (c)1998-2020 Matt Pharr, Wenzel Jakob, and Greg Humphreys.\n");
        printf("The source code to pbrt (but *not* the book contents) is covered "
               "by the Apache 2.0 License.\n");
        printf("See the file LICENSE.txt for the conditions of the license.\n");
        fflush(stdout);
    }

    // Check validity of provided arguments
    if (renderCoordSys == "camera")
        options.renderingSpace = RenderingCoordinateSystem::Camera;
    else if (renderCoordSys == "cameraworld")
        options.renderingSpace = RenderingCoordinateSystem::CameraWorld;
    else if (renderCoordSys == "world")
        options.renderingSpace = RenderingCoordinateSystem::World;
    else
        ErrorExit("%s: unknown rendering coordinate system.", renderCoordSys);

    if (!options.mseReferenceImage.empty() && options.mseReferenceOutput.empty())
        ErrorExit("Must provide MSE reference output filename via "
                  "--mse-reference-out");
    if (!options.mseReferenceOutput.empty() && options.mseReferenceImage.empty())
        ErrorExit("Must provide MSE reference image via --mse-reference-image");

    options.logLevel = LogLevelFromString(logLevel);

    // Initialize pbrt
    InitPBRT(options);

    if (format || toPly || options.upgrade) {
        FormattingScene formattingScene(toPly, options.upgrade);
        ParseFiles(&formattingScene, filenames);
    } else {
        // Parse provided scene description files
        ParsedScene scene;
        ParseFiles(&scene, filenames);

        // Render the scene
        if (options.useGPU)
            GPURender(scene);
        else
            CPURender(scene);

        LOG_VERBOSE("Memory used after post-render cleanup: %s", GetCurrentRSS());
        // Clean up after rendering the scene
        CleanupPBRT();
    }
    return 0;
}